

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InstancedGridRenderTest::iterate
          (InstancedGridRenderTest *this)

{
  size_t *this_00;
  bool bVar1;
  int iVar2;
  RenderTarget *pRVar3;
  RenderContext *context;
  TestLog *pTVar4;
  undefined1 local_318 [8];
  GridProgram program;
  undefined1 local_1b0 [8];
  Surface surface;
  undefined1 local_188 [8];
  GLContext ctx;
  int renderTargetHeight;
  int renderTargetWidth;
  InstancedGridRenderTest *this_local;
  
  pRVar3 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar3);
  ctx.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = de::min<int>(0x400,iVar2);
  pRVar3 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getHeight(pRVar3);
  ctx.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = de::min<int>(0x400,iVar2);
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  this_00 = &surface.m_pixels.m_cap;
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)this_00,0,0,
             ctx.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage._4_4_,
             (int)ctx.m_programs.
                  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  sglr::GLContext::GLContext((GLContext *)local_188,context,pTVar4,3,(IVec4 *)this_00);
  tcu::Surface::Surface
            ((Surface *)local_1b0,
             ctx.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage._4_4_,
             (int)ctx.m_programs.
                  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  GridProgram::GridProgram((GridProgram *)local_318);
  renderTo(this,(Context *)local_188,(ShaderProgram *)local_318,(Surface *)local_1b0);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = verifyImageYellowGreen((Surface *)local_1b0,pTVar4);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Result image invalid");
  }
  GridProgram::~GridProgram((GridProgram *)local_318);
  tcu::Surface::~Surface((Surface *)local_1b0);
  sglr::GLContext::~GLContext((GLContext *)local_188);
  return STOP;
}

Assistant:

InstancedGridRenderTest::IterateResult InstancedGridRenderTest::iterate (void)
{
	const int renderTargetWidth  = de::min(1024, m_context.getRenderTarget().getWidth());
	const int renderTargetHeight = de::min(1024, m_context.getRenderTarget().getHeight());

	sglr::GLContext ctx		(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));
	tcu::Surface	surface	(renderTargetWidth, renderTargetHeight);
	GridProgram		program;

	// render

	renderTo(ctx, program, surface);

	// verify image
	// \note the green/yellow pattern is only for clarity. The test will only verify that all instances were drawn by looking for anything non-green/yellow.
	if (verifyImageYellowGreen(surface, m_testCtx.getLog()))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result image invalid");
	return STOP;
}